

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O0

int nn_sinproc_send(nn_pipebase *self,nn_msg *msg)

{
  nn_fsm_fn *pp_Var1;
  nn_msg *src;
  nn_msg *dst;
  nn_fsm *dst_00;
  size_t sVar2;
  nn_fsm *self_00;
  void *__src;
  size_t __n;
  nn_chunkref *in_RSI;
  long in_RDI;
  nn_msg nmsg;
  nn_sinproc *sinproc;
  nn_msg *in_stack_ffffffffffffff50;
  long local_88;
  nn_chunkref nStack_40;
  long local_20;
  nn_chunkref *local_18;
  int local_4;
  
  if (in_RDI == 0) {
    local_88 = 0;
  }
  else {
    local_88 = in_RDI + -0x68;
  }
  local_20 = local_88;
  if (*(int *)(local_88 + 0x58) == 5) {
    local_4 = -0x68;
  }
  else {
    if (*(int *)(local_88 + 0x58) != 4) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(uint *)(local_20 + 0x58),
              "NN_SINPROC_STATE_ACTIVE",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/sinproc.c"
              ,0x96);
      fflush(_stderr);
      nn_err_abort();
    }
    if ((*(uint *)(local_88 + 0x5c) & 1) != 0) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!(sinproc->flags & NN_SINPROC_FLAG_SENDING)"
              ,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/sinproc.c"
              ,0x97);
      fflush(_stderr);
      nn_err_abort();
    }
    local_18 = in_RSI;
    src = (nn_msg *)nn_chunkref_size(&in_stack_ffffffffffffff50->sphdr);
    nn_chunkref_size(&in_stack_ffffffffffffff50->sphdr);
    nn_msg_init(in_stack_ffffffffffffff50,(size_t)src);
    dst = (nn_msg *)nn_chunkref_data(&nStack_40);
    dst_00 = (nn_fsm *)nn_chunkref_data(local_18);
    sVar2 = nn_chunkref_size(&dst->sphdr);
    memcpy(dst,dst_00,sVar2);
    self_00 = (nn_fsm *)nn_chunkref_data(&nStack_40);
    sVar2 = nn_chunkref_size(&dst->sphdr);
    pp_Var1 = &self_00->fn;
    __src = nn_chunkref_data(local_18 + 2);
    __n = nn_chunkref_size(&dst->sphdr);
    memcpy((void *)((long)pp_Var1 + sVar2),__src,__n);
    nn_msg_term((nn_msg *)0x14be64);
    nn_msg_term((nn_msg *)0x14be78);
    nn_msg_mv(dst,src);
    *(uint *)(local_20 + 0x5c) = *(uint *)(local_20 + 0x5c) | 1;
    nn_fsm_raiseto(self_00,dst_00,(nn_fsm_event *)dst,(int)((ulong)src >> 0x20),(int)src,
                   (void *)0x14bee1);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int nn_sinproc_send (struct nn_pipebase *self, struct nn_msg *msg)
{
    struct nn_sinproc *sinproc;
    struct nn_msg nmsg;

    sinproc = nn_cont (self, struct nn_sinproc, pipebase);

    /*  If the peer have already closed the connection, we cannot send
        anymore. */
    if (sinproc->state == NN_SINPROC_STATE_DISCONNECTED)
        return -ECONNRESET;

    /*  Sanity checks. */
    nn_assert_state (sinproc, NN_SINPROC_STATE_ACTIVE);
    nn_assert (!(sinproc->flags & NN_SINPROC_FLAG_SENDING));

    nn_msg_init (&nmsg,
        nn_chunkref_size (&msg->sphdr) +
        nn_chunkref_size (&msg->body));
    memcpy (nn_chunkref_data (&nmsg.body),
        nn_chunkref_data (&msg->sphdr),
        nn_chunkref_size (&msg->sphdr));
    memcpy ((char *)nn_chunkref_data (&nmsg.body) +
        nn_chunkref_size (&msg->sphdr),
        nn_chunkref_data (&msg->body),
        nn_chunkref_size (&msg->body));
    nn_msg_term (msg);

    /*  Expose the message to the peer. */
    nn_msg_term (&sinproc->msg);
    nn_msg_mv (&sinproc->msg, &nmsg);

    /*  Notify the peer that there's a message to get. */
    sinproc->flags |= NN_SINPROC_FLAG_SENDING;
    nn_fsm_raiseto (&sinproc->fsm, &sinproc->peer->fsm,
        &sinproc->peer->event_sent, NN_SINPROC_SRC_PEER,
        NN_SINPROC_SENT, sinproc);

    return 0;
}